

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_both.cc
# Opt level: O3

bool bssl::tls13_add_finished(SSL_HANDSHAKE *hs)

{
  SSL *ssl;
  bool bVar1;
  int iVar2;
  size_t verify_data_len;
  ScopedCBB cbb;
  CBB body;
  uint8_t verify_data [64];
  size_t local_c0;
  CBB local_b8;
  CBB local_88;
  uint8_t local_58 [72];
  
  ssl = hs->ssl;
  bVar1 = tls13_finished_mac(hs,local_58,&local_c0,(bool)(ssl->field_0xa4 & 1));
  if (bVar1) {
    CBB_zero(&local_b8);
    bVar1 = (*ssl->method->init_message)(ssl,&local_b8,&local_88,'\x14');
    if ((bVar1) && (iVar2 = CBB_add_bytes(&local_88,local_58,local_c0), iVar2 != 0)) {
      bVar1 = ssl_add_message_cbb(ssl,&local_b8);
    }
    else {
      bVar1 = false;
    }
    CBB_cleanup(&local_b8);
    return bVar1;
  }
  ssl_send_alert(ssl,2,0x50);
  ERR_put_error(0x10,0,0x8e,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                ,0x277);
  return false;
}

Assistant:

bool tls13_add_finished(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  size_t verify_data_len;
  uint8_t verify_data[EVP_MAX_MD_SIZE];

  if (!tls13_finished_mac(hs, verify_data, &verify_data_len, ssl->server)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
    OPENSSL_PUT_ERROR(SSL, SSL_R_DIGEST_CHECK_FAILED);
    return false;
  }

  ScopedCBB cbb;
  CBB body;
  if (!ssl->method->init_message(ssl, cbb.get(), &body, SSL3_MT_FINISHED) ||
      !CBB_add_bytes(&body, verify_data, verify_data_len) ||
      !ssl_add_message_cbb(ssl, cbb.get())) {
    return false;
  }

  return true;
}